

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::accessing_bounding_box_type
               (NegativeTestContext *ctx)

{
  uint uVar1;
  string *this;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  uVar1 = (*ctx->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar1 & 0xf) == 3) {
    uVar1 = (*ctx->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar1 & 0xf0) == 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"gl_BoundingBoxEXT",&local_49);
      executeAccessingBoundingBoxType(ctx,&local_28,GLSL_VERSION_310_ES);
      this = &local_28;
      goto LAB_0136afdc;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"gl_BoundingBox",&local_49)
  ;
  executeAccessingBoundingBoxType(ctx,&local_48,GLSL_VERSION_320_ES);
  this = &local_48;
LAB_0136afdc:
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void accessing_bounding_box_type (NegativeTestContext& ctx)
{
	// Extension requirements and name differences depending on the context
	if ((ctx.getRenderContext().getType().getMajorVersion() == 3) && (ctx.getRenderContext().getType().getMinorVersion() == 1))
	{
		executeAccessingBoundingBoxType(ctx, "gl_BoundingBoxEXT", glu::GLSL_VERSION_310_ES);
	}
	else
	{
		executeAccessingBoundingBoxType(ctx, "gl_BoundingBox", glu::GLSL_VERSION_320_ES);
	}

}